

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

void pnga_nbget_ghost_dir(Integer g_a,Integer *mask,Integer *nbhandle)

{
  global_array_t *pgVar1;
  ushort uVar2;
  int iVar3;
  C_Integer *pCVar4;
  Integer proc;
  Integer IVar5;
  long lVar6;
  long lVar7;
  ushort uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  C_Integer CVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer hi_rem [7];
  Integer lo_rem [7];
  Integer subscript [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer ld [7];
  
  lVar7 = g_a + 1000;
  uVar17 = 0;
  proc = pnga_nodeid();
  uVar2 = GA[lVar7].ndim;
  if ((short)uVar2 < 1) {
    uVar2 = 0;
  }
  for (; uVar2 != uVar17; uVar17 = uVar17 + 1) {
    lVar9 = mask[uVar17];
    lVar10 = -lVar9;
    if (0 < lVar9) {
      lVar10 = lVar9;
    }
    if ((lVar9 != 0) && (lVar10 != 1)) {
      pnga_error("nga_nbget_ghost_dir: invalid mask entry",lVar9);
    }
  }
  pnga_distribution(g_a,proc,lo_loc,hi_loc);
  pgVar1 = GA + lVar7;
  for (uVar17 = 0; (uint)uVar2 * 8 != uVar17; uVar17 = uVar17 + 8) {
    lVar9 = *(long *)((long)pgVar1->dims + uVar17);
    lVar10 = *(long *)((long)pgVar1->width + uVar17);
    if (*(long *)((long)mask + uVar17) == -1) {
      lVar6 = *(long *)((long)lo_loc + uVar17);
      if (lVar6 == 1) {
        *(long *)((long)lo_rem + uVar17) = (lVar9 - lVar10) + 1;
        *(long *)((long)hi_rem + uVar17) = lVar9;
      }
      else {
        *(long *)((long)lo_rem + uVar17) = lVar6 - lVar10;
        *(long *)((long)hi_rem + uVar17) = lVar6 + -1;
      }
    }
    else {
      if (*(long *)((long)mask + uVar17) == 1) {
        lVar6 = *(long *)((long)hi_loc + uVar17);
        if (lVar6 == lVar9) {
          *(undefined8 *)((long)lo_rem + uVar17) = 1;
        }
        else {
          *(long *)((long)lo_rem + uVar17) = lVar6 + 1;
          lVar10 = lVar10 + lVar6;
        }
      }
      else {
        *(undefined8 *)((long)lo_rem + uVar17) = *(undefined8 *)((long)lo_loc + uVar17);
        lVar10 = *(long *)((long)hi_loc + uVar17);
      }
      *(long *)((long)hi_rem + uVar17) = lVar10;
    }
  }
  for (uVar17 = 0; uVar2 != uVar17; uVar17 = uVar17 + 1) {
    if (mask[uVar17] == -1) {
      subscript[uVar17] = 0;
      lVar9 = GA[g_a + 1000].width[uVar17];
    }
    else if (mask[uVar17] == 1) {
      lVar9 = GA[g_a + 1000].width[uVar17];
      subscript[uVar17] = (hi_loc[uVar17] - lo_loc[uVar17]) + lVar9 + 1;
    }
    else {
      lVar9 = GA[g_a + 1000].width[uVar17];
      subscript[uVar17] = lVar9;
    }
    ld[uVar17] = (hi_loc[uVar17] - lo_loc[uVar17]) + lVar9 * 2 + 1;
  }
  uVar2 = pgVar1->ndim;
  lVar10 = (long)(short)uVar2;
  lVar9 = lVar10 + -1;
  iVar15 = pgVar1->distr_type;
  if (iVar15 - 1U < 3) {
    lVar11 = (long)(int)proc % pgVar1->num_blocks[0];
    _index[0] = (int)lVar11;
    IVar5 = proc;
    lVar6 = 0;
    while (lVar6 + 1 < lVar10) {
      IVar5 = (long)((int)IVar5 - (int)lVar11) / GA[g_a + 1000].num_blocks[lVar6];
      lVar11 = (long)(int)IVar5 % GA[g_a + 1000].num_blocks[lVar6 + 1];
      _index[lVar6 + 1] = (int)lVar11;
      lVar6 = lVar6 + 1;
    }
    lVar6 = 0;
    uVar8 = 0;
    if (0 < (short)uVar2) {
      uVar8 = uVar2;
    }
    for (; (ulong)uVar8 * 4 != lVar6; lVar6 = lVar6 + 4) {
      iVar15 = *(int *)((long)_index + lVar6);
      lVar11 = *(long *)((long)GA[g_a + 1000].block_dims + lVar6 * 2);
      *(long *)((long)_lo + lVar6 * 2) = lVar11 * iVar15 + 1;
      lVar11 = ((long)iVar15 + 1) * lVar11;
      lVar14 = *(long *)((long)GA[g_a + 1000].dims + lVar6 * 2);
      if (lVar14 <= lVar11) {
        lVar11 = lVar14;
      }
      *(long *)((long)_hi + lVar6 * 2) = lVar11;
    }
  }
  else if (iVar15 == 4) {
    lVar11 = (long)(int)proc % pgVar1->num_blocks[0];
    _index[0] = (int)lVar11;
    IVar5 = proc;
    lVar6 = 0;
    while (lVar6 + 1 < lVar10) {
      IVar5 = (long)((int)IVar5 - (int)lVar11) / GA[g_a + 1000].num_blocks[lVar6];
      lVar11 = (long)(int)IVar5 % GA[g_a + 1000].num_blocks[lVar6 + 1];
      _index[lVar6 + 1] = (int)lVar11;
      lVar6 = lVar6 + 1;
    }
    lVar6 = 0;
    if ((short)uVar2 < 1) {
      uVar2 = 0;
    }
    iVar15 = 0;
    for (; (ulong)uVar2 * 4 != lVar6; lVar6 = lVar6 + 4) {
      pCVar4 = GA[lVar7].mapc;
      iVar3 = *(int *)((long)_index + lVar6);
      lVar14 = (long)iVar15 + (long)iVar3;
      *(C_Integer *)((long)_lo + lVar6 * 2) = pCVar4[lVar14];
      lVar11 = *(long *)((long)pgVar1->num_blocks + lVar6 * 2);
      if ((long)iVar3 < lVar11 + -1) {
        lVar14 = pCVar4[lVar14 + 1] + -1;
      }
      else {
        lVar14 = *(long *)((long)pgVar1->dims + lVar6 * 2);
      }
      *(long *)((long)_hi + lVar6 * 2) = lVar14;
      iVar15 = iVar15 + (int)lVar11;
    }
  }
  else if (iVar15 == 0) {
    if (pgVar1->num_rstrctd == 0) {
      lVar11 = 0;
      lVar6 = lVar10;
      if (lVar10 < 1) {
        lVar6 = lVar11;
      }
      lVar14 = 1;
      for (; lVar6 != lVar11; lVar11 = lVar11 + 1) {
        lVar14 = lVar14 * GA[g_a + 1000].nblock[lVar11];
      }
      if ((proc < 0) || (lVar14 <= proc)) {
        for (lVar11 = 0; lVar6 != lVar11; lVar11 = lVar11 + 1) {
          _lo[lVar11] = 0;
          _hi[lVar11] = -1;
        }
      }
      else {
        lVar11 = 0;
        IVar5 = proc;
        for (lVar14 = 0; lVar6 != lVar14; lVar14 = lVar14 + 1) {
          lVar16 = (long)GA[g_a + 1000].nblock[lVar14];
          lVar12 = IVar5 % lVar16;
          pCVar4 = pgVar1->mapc;
          _lo[lVar14] = pCVar4[lVar12 + lVar11];
          if (lVar12 == lVar16 + -1) {
            CVar13 = GA[g_a + 1000].dims[lVar14];
          }
          else {
            CVar13 = pCVar4[lVar12 + lVar11 + 1] + -1;
          }
          lVar11 = lVar11 + lVar16;
          _hi[lVar14] = CVar13;
          IVar5 = IVar5 / lVar16;
        }
      }
    }
    else if (proc < pgVar1->num_rstrctd) {
      lVar6 = 1;
      lVar14 = 0;
      lVar11 = lVar10;
      if (lVar10 < 1) {
        lVar11 = lVar14;
      }
      for (; lVar11 != lVar14; lVar14 = lVar14 + 1) {
        lVar6 = lVar6 * GA[g_a + 1000].nblock[lVar14];
      }
      if ((proc < 0) || (lVar6 <= proc)) {
        for (lVar6 = 0; lVar11 != lVar6; lVar6 = lVar6 + 1) {
          _lo[lVar6] = 0;
          _hi[lVar6] = -1;
        }
      }
      else {
        lVar14 = 0;
        IVar5 = proc;
        for (lVar6 = 0; lVar11 != lVar6; lVar6 = lVar6 + 1) {
          lVar16 = (long)GA[g_a + 1000].nblock[lVar6];
          lVar12 = IVar5 % lVar16;
          pCVar4 = pgVar1->mapc;
          _lo[lVar6] = pCVar4[lVar12 + lVar14];
          if (lVar12 == lVar16 + -1) {
            CVar13 = GA[g_a + 1000].dims[lVar6];
          }
          else {
            CVar13 = pCVar4[lVar12 + lVar14 + 1] + -1;
          }
          lVar14 = lVar14 + lVar16;
          _hi[lVar6] = CVar13;
          IVar5 = IVar5 / lVar16;
        }
      }
    }
    else {
      lVar6 = 0;
      iVar15 = 0;
      if (0 < (short)uVar2) {
        iVar15 = (int)(short)uVar2;
      }
      for (; iVar15 != lVar6; lVar6 = lVar6 + 1) {
        _lo[lVar6] = 0;
        _hi[lVar6] = -1;
      }
    }
  }
  if (lVar9 == 0) {
    ld[0] = (_hi[0] - _lo[0]) + GA[lVar7].width[0] * 2 + 1;
  }
  lVar7 = 0;
  if (lVar9 < 1) {
    lVar9 = lVar7;
  }
  lVar6 = 1;
  for (lVar11 = 0; lVar9 != lVar11; lVar11 = lVar11 + 1) {
    lVar7 = lVar7 + subscript[lVar11] * lVar6;
    lVar14 = (_hi[lVar11] - _lo[lVar11]) + GA[g_a + 1000].width[lVar11] * 2 + 1;
    ld[lVar11] = lVar14;
    lVar6 = lVar6 * lVar14;
  }
  pnga_nbget(g_a,lo_rem,hi_rem,
             pgVar1->ptr[proc] + (long)pgVar1->elemsize * (lVar6 * subscript[lVar10 + -1] + lVar7),
             ld,nbhandle);
  return;
}

Assistant:

void pnga_nbget_ghost_dir(Integer g_a,
                               Integer *mask,
                               Integer *nbhandle)
{
  Integer handle = GA_OFFSET + g_a;
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM], lo_rem[MAXDIM], hi_rem[MAXDIM];
  Integer subscript[MAXDIM], ld[MAXDIM];
  Integer i, ndim, dim, width;
  char *ptr_loc;
  Integer me = pnga_nodeid();
  /*Integer p_handle;*/
  ndim = GA[handle].ndim;
  /*p_handle = GA[handle].p_handle;*/
  /* check mask to see that it corresponds to a valid direction */
  for (i=0; i<ndim; i++) {
    if (labs(mask[i]) != 0 && labs(mask[i]) != 1)
      pnga_error("nga_nbget_ghost_dir: invalid mask entry", mask[i]);
  }

  /* get range of data on local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* locate data on remote processor */
  for (i=0; i<ndim; i++) {
    dim = (Integer)GA[handle].dims[i];
    width = (Integer)GA[handle].width[i];
    if (mask[i] == 1) {
      if (hi_loc[i] == dim) {
        lo_rem[i] = 1;
        hi_rem[i] = width;
      } else {
        lo_rem[i] = hi_loc[i]+1;
        hi_rem[i] = hi_loc[i]+width;
      }
    } else if (mask[i] == -1) {
      if (lo_loc[i] == 1) {
        lo_rem[i] = dim - width + 1;
        hi_rem[i] = dim;
      } else {
        lo_rem[i] = lo_loc[i] - width;
        hi_rem[i] = lo_loc[i] - 1;
      }
    } else {
      lo_rem[i] = lo_loc[i];
      hi_rem[i] = hi_loc[i];
    }
  }
  
  /* Get pointer to data destination on local block. Start by
     by finding subscript to origin of destination block */
  for (i=0; i<ndim; i++) {
    if (mask[i] == 1) {
      subscript[i] = hi_loc[i]-lo_loc[i]+1+GA[handle].width[i];
    } else if (mask[i] == -1) {
      subscript[i] = 0;
    } else {
      subscript[i] = GA[handle].width[i];
    }
    ld[i] = hi_loc[i]-lo_loc[i]+1+2*GA[handle].width[i];
  }
  gam_LocationWithGhosts(me, handle, subscript, &ptr_loc, ld);
  /* get data */
  pnga_nbget(g_a,lo_rem,hi_rem,ptr_loc,ld,nbhandle);  
}